

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_andc_sparc64
               (TCGContext_conflict8 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t bofs,
               uint32_t oprsz,uint32_t maxsz)

{
  if (aofs == bofs) {
    tcg_gen_gvec_dup8i_sparc64(tcg_ctx,dofs,oprsz,maxsz,'\0');
    return;
  }
  tcg_gen_gvec_3_sparc64(tcg_ctx,dofs,aofs,bofs,oprsz,maxsz,&tcg_gen_gvec_andc_sparc64::g);
  return;
}

Assistant:

void tcg_gen_gvec_andc(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                       uint32_t bofs, uint32_t oprsz, uint32_t maxsz)
{
    static const GVecGen3 g = {
        .fni8 = tcg_gen_andc_i64,
        .fniv = tcg_gen_andc_vec,
        .fno = gen_helper_gvec_andc,
        .prefer_i64 = TCG_TARGET_REG_BITS == 64,
    };

    if (aofs == bofs) {
        tcg_gen_gvec_dup8i(tcg_ctx, dofs, oprsz, maxsz, 0);
    } else {
        tcg_gen_gvec_3(tcg_ctx, dofs, aofs, bofs, oprsz, maxsz, &g);
    }
}